

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_no_callback_on_close(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  undefined8 uVar4;
  int in_ECX;
  int extraout_EDX;
  long lVar5;
  uv_loop_t **__s1;
  long *plVar6;
  uv_fs_event_t *puVar7;
  int64_t eval_b;
  int64_t eval_a;
  char acStack_7e8 [24];
  char *apcStack_7d0 [15];
  undefined1 auStack_758 [104];
  undefined8 uStack_6f0;
  uv_fs_event_t *puStack_6e8;
  long lStack_6e0;
  long lStack_6d8;
  code *pcStack_6d0;
  long lStack_6c8;
  long lStack_6c0;
  code *pcStack_6b8;
  size_t sStack_6a8;
  size_t sStack_6a0;
  size_t sStack_698;
  char acStack_690 [1032];
  undefined8 uStack_288;
  uv_fs_event_t uStack_238;
  undefined1 auStack_1c0 [104];
  undefined8 uStack_158;
  code *pcStack_150;
  undefined8 uStack_140;
  code *pcStack_138;
  long lStack_130;
  long lStack_128;
  code *pcStack_120;
  long lStack_118;
  long lStack_110;
  code *pcStack_108;
  long lStack_100;
  long lStack_f8;
  code *pcStack_f0;
  undefined8 uStack_e0;
  long lStack_d8;
  undefined8 uStack_d0;
  code *pcStack_c8;
  long lStack_b8;
  long lStack_b0;
  undefined1 auStack_a8 [120];
  code *pcStack_30;
  long local_20;
  long local_18;
  
  pcStack_30 = (code *)0x188d8b;
  uVar3 = uv_default_loop();
  pcStack_30 = (code *)0x188d9d;
  remove("watch_dir/file1");
  pcStack_30 = (code *)0x188da9;
  remove("watch_dir/");
  pcStack_30 = (code *)0x188db5;
  create_dir("watch_dir");
  pcStack_30 = (code *)0x188dbd;
  create_file("watch_dir/file1");
  pcStack_30 = (code *)0x188dcc;
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  local_18 = (long)iVar2;
  local_20 = 0;
  if (local_18 == 0) {
    in_ECX = 0;
    pcStack_30 = (code *)0x188e08;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file1");
    local_18 = (long)iVar2;
    local_20 = 0;
    if (local_18 != 0) goto LAB_00188f04;
    pcStack_30 = (code *)0x188e3b;
    uv_close(&fs_event,close_cb);
    pcStack_30 = (code *)0x188e45;
    uv_run(uVar3,0);
    local_18 = (long)fs_event_cb_called;
    local_20 = 0;
    if (local_18 != 0) goto LAB_00188f13;
    local_18 = 1;
    local_20 = (long)close_cb_called;
    if (local_20 != 1) goto LAB_00188f22;
    pcStack_30 = (code *)0x188e9b;
    remove("watch_dir/file1");
    pcStack_30 = (code *)0x188ea7;
    remove("watch_dir/");
    pcStack_30 = (code *)0x188eb8;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_30 = (code *)0x188ec2;
    uv_run(uVar3,0);
    local_18 = 0;
    pcStack_30 = (code *)0x188ed3;
    iVar2 = uv_loop_close(uVar3);
    local_20 = (long)iVar2;
    if (local_18 == local_20) {
      pcStack_30 = (code *)0x188eeb;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x188f04;
    run_test_fs_event_no_callback_on_close_cold_1();
LAB_00188f04:
    pcStack_30 = (code *)0x188f13;
    run_test_fs_event_no_callback_on_close_cold_2();
LAB_00188f13:
    pcStack_30 = (code *)0x188f22;
    run_test_fs_event_no_callback_on_close_cold_3();
LAB_00188f22:
    pcStack_30 = (code *)0x188f31;
    run_test_fs_event_no_callback_on_close_cold_4();
  }
  pcStack_30 = run_test_fs_event_immediate_close;
  run_test_fs_event_no_callback_on_close_cold_5();
  pcStack_c8 = (code *)0x188f4d;
  pcStack_30 = (code *)uVar3;
  uVar3 = uv_default_loop();
  pcStack_c8 = (code *)0x188f5d;
  iVar2 = uv_timer_init(uVar3,auStack_a8);
  lStack_b0 = (long)iVar2;
  lStack_b8 = 0;
  if (lStack_b0 == 0) {
    in_ECX = 0;
    pcStack_c8 = (code *)0x188f95;
    iVar2 = uv_timer_start(auStack_a8,timer_cb,1);
    lStack_b0 = (long)iVar2;
    lStack_b8 = 0;
    if (lStack_b0 != 0) goto LAB_0018903e;
    pcStack_c8 = (code *)0x188fbf;
    uv_run(uVar3,0);
    lStack_b0 = 2;
    lStack_b8 = (long)close_cb_called;
    if (lStack_b8 != 2) goto LAB_0018904d;
    pcStack_c8 = (code *)0x188ff1;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_c8 = (code *)0x188ffb;
    uv_run(uVar3,0);
    lStack_b0 = 0;
    pcStack_c8 = (code *)0x18900c;
    iVar2 = uv_loop_close(uVar3);
    lStack_b8 = (long)iVar2;
    if (lStack_b0 == lStack_b8) {
      pcStack_c8 = (code *)0x189024;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_c8 = (code *)0x18903e;
    run_test_fs_event_immediate_close_cold_1();
LAB_0018903e:
    pcStack_c8 = (code *)0x18904d;
    run_test_fs_event_immediate_close_cold_2();
LAB_0018904d:
    pcStack_c8 = (code *)0x18905c;
    run_test_fs_event_immediate_close_cold_3();
  }
  plVar6 = &lStack_b0;
  pcStack_c8 = timer_cb;
  run_test_fs_event_immediate_close_cold_4();
  pcStack_c8 = (code *)0x1e8b0e;
  pcStack_f0 = (code *)0x189085;
  uStack_d0 = uVar3;
  iVar2 = uv_fs_event_init(plVar6[1],&fs_event);
  lStack_d8 = (long)iVar2;
  uStack_e0 = 0;
  if (lStack_d8 == 0) {
    in_ECX = 0;
    pcStack_f0 = (code *)0x1890bd;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,".");
    lStack_d8 = (long)iVar2;
    uStack_e0 = 0;
    if (lStack_d8 == 0) {
      pcStack_f0 = (code *)0x1890ef;
      uv_close(&fs_event,close_cb);
      iVar2 = uv_close(plVar6,close_cb);
      return iVar2;
    }
  }
  else {
    pcStack_f0 = (code *)0x189110;
    timer_cb_cold_1();
  }
  pcStack_f0 = run_test_fs_event_close_with_pending_event;
  timer_cb_cold_2();
  pcStack_108 = (code *)0x189129;
  pcStack_f0 = (code *)plVar6;
  uVar3 = uv_default_loop();
  pcStack_108 = (code *)0x189138;
  create_dir("watch_dir");
  pcStack_108 = (code *)0x189144;
  create_file("watch_dir/file");
  pcStack_108 = (code *)0x189153;
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  lStack_f8 = (long)iVar2;
  lStack_100 = 0;
  if (lStack_f8 == 0) {
    in_ECX = 0;
    pcStack_108 = (code *)0x18918d;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir");
    lStack_f8 = (long)iVar2;
    lStack_100 = 0;
    if (lStack_f8 != 0) goto LAB_00189262;
    pcStack_108 = (code *)0x1891b7;
    touch_file("watch_dir/file");
    pcStack_108 = (code *)0x1891ca;
    uv_close(&fs_event,close_cb);
    pcStack_108 = (code *)0x1891d4;
    uv_run(uVar3,0);
    lStack_f8 = 1;
    lStack_100 = (long)close_cb_called;
    if (lStack_100 != 1) goto LAB_0018926f;
    pcStack_108 = (code *)0x1891ff;
    remove("watch_dir/file");
    pcStack_108 = (code *)0x18920b;
    remove("watch_dir/");
    pcStack_108 = (code *)0x18921c;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_108 = (code *)0x189226;
    uv_run(uVar3,0);
    lStack_f8 = 0;
    pcStack_108 = (code *)0x189237;
    iVar2 = uv_loop_close(uVar3);
    lStack_100 = (long)iVar2;
    if (lStack_f8 == lStack_100) {
      pcStack_108 = (code *)0x18924d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_108 = (code *)0x189262;
    run_test_fs_event_close_with_pending_event_cold_1();
LAB_00189262:
    pcStack_108 = (code *)0x18926f;
    run_test_fs_event_close_with_pending_event_cold_2();
LAB_0018926f:
    pcStack_108 = (code *)0x18927c;
    run_test_fs_event_close_with_pending_event_cold_3();
  }
  pcStack_108 = run_test_fs_event_close_with_pending_delete_event;
  run_test_fs_event_close_with_pending_event_cold_4();
  pcStack_120 = (code *)0x189293;
  pcStack_108 = (code *)uVar3;
  uVar3 = uv_default_loop();
  pcStack_120 = (code *)0x1892a2;
  create_dir("watch_dir");
  pcStack_120 = (code *)0x1892ae;
  create_file("watch_dir/file");
  pcStack_120 = (code *)0x1892bd;
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  lStack_110 = (long)iVar2;
  lStack_118 = 0;
  if (lStack_110 == 0) {
    in_ECX = 0;
    pcStack_120 = (code *)0x1892f7;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_fail,"watch_dir/file");
    lStack_110 = (long)iVar2;
    lStack_118 = 0;
    if (lStack_110 != 0) goto LAB_001893d2;
    pcStack_120 = (code *)0x189321;
    remove("watch_dir/file");
    pcStack_120 = (code *)0x18932b;
    uv_sleep(0x44c);
    pcStack_120 = (code *)0x189333;
    uv_update_time(uVar3);
    pcStack_120 = (code *)0x189346;
    uv_close(&fs_event,close_cb);
    pcStack_120 = (code *)0x189350;
    uv_run(uVar3,0);
    lStack_110 = 1;
    lStack_118 = (long)close_cb_called;
    if (lStack_118 != 1) goto LAB_001893df;
    pcStack_120 = (code *)0x18937b;
    remove("watch_dir/");
    pcStack_120 = (code *)0x18938c;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_120 = (code *)0x189396;
    uv_run(uVar3,0);
    lStack_110 = 0;
    pcStack_120 = (code *)0x1893a7;
    iVar2 = uv_loop_close(uVar3);
    lStack_118 = (long)iVar2;
    if (lStack_110 == lStack_118) {
      pcStack_120 = (code *)0x1893bd;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x1893d2;
    run_test_fs_event_close_with_pending_delete_event_cold_1();
LAB_001893d2:
    pcStack_120 = (code *)0x1893df;
    run_test_fs_event_close_with_pending_delete_event_cold_2();
LAB_001893df:
    pcStack_120 = (code *)0x1893ec;
    run_test_fs_event_close_with_pending_delete_event_cold_3();
  }
  pcStack_120 = run_test_fs_event_close_in_callback;
  run_test_fs_event_close_with_pending_delete_event_cold_4();
  pcStack_138 = (code *)0x189403;
  pcStack_120 = (code *)uVar3;
  uVar3 = uv_default_loop();
  pcStack_138 = (code *)0x18940d;
  fs_event_unlink_files((uv_timer_t *)0x0);
  pcStack_138 = (code *)0x189419;
  create_dir("watch_dir");
  pcStack_138 = (code *)0x189428;
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  lStack_128 = (long)iVar2;
  lStack_130 = 0;
  if (lStack_128 == 0) {
    in_ECX = 0;
    pcStack_138 = (code *)0x189462;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_close,"watch_dir");
    lStack_128 = (long)iVar2;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001895bf;
    pcStack_138 = (code *)0x18948f;
    iVar2 = uv_timer_init(uVar3,&timer);
    lStack_128 = (long)iVar2;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001895cc;
    in_ECX = 0;
    pcStack_138 = (code *)0x1894c7;
    iVar2 = uv_timer_start(&timer,fs_event_create_files,100);
    lStack_128 = (long)iVar2;
    lStack_130 = 0;
    if (lStack_128 != 0) goto LAB_001895d9;
    pcStack_138 = (code *)0x1894ef;
    uv_run(uVar3,0);
    pcStack_138 = (code *)0x189502;
    uv_close(&timer,close_cb);
    pcStack_138 = (code *)0x18950f;
    uv_run(uVar3,1);
    lStack_128 = 2;
    lStack_130 = (long)close_cb_called;
    if (lStack_130 != 2) goto LAB_001895e6;
    lStack_128 = 3;
    lStack_130 = (long)fs_event_cb_called;
    if (lStack_130 != 3) goto LAB_001895f3;
    pcStack_138 = (code *)0x18955c;
    fs_event_unlink_files((uv_timer_t *)0x0);
    pcStack_138 = (code *)0x189568;
    remove("watch_dir/");
    pcStack_138 = (code *)0x189579;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_138 = (code *)0x189583;
    uv_run(uVar3,0);
    lStack_128 = 0;
    pcStack_138 = (code *)0x189594;
    iVar2 = uv_loop_close(uVar3);
    lStack_130 = (long)iVar2;
    if (lStack_128 == lStack_130) {
      pcStack_138 = (code *)0x1895aa;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_138 = (code *)0x1895bf;
    run_test_fs_event_close_in_callback_cold_1();
LAB_001895bf:
    pcStack_138 = (code *)0x1895cc;
    run_test_fs_event_close_in_callback_cold_2();
LAB_001895cc:
    pcStack_138 = (code *)0x1895d9;
    run_test_fs_event_close_in_callback_cold_3();
LAB_001895d9:
    pcStack_138 = (code *)0x1895e6;
    run_test_fs_event_close_in_callback_cold_4();
LAB_001895e6:
    pcStack_138 = (code *)0x1895f3;
    run_test_fs_event_close_in_callback_cold_5();
LAB_001895f3:
    pcStack_138 = (code *)0x189600;
    run_test_fs_event_close_in_callback_cold_6();
  }
  pcStack_138 = fs_event_cb_close;
  run_test_fs_event_close_in_callback_cold_7();
  pcStack_138 = (code *)(long)in_ECX;
  uStack_140 = 0;
  if (pcStack_138 == (code *)0x0) {
    pcStack_138 = (code *)(long)fs_event_cb_called;
    uStack_140 = 3;
    in_ECX = fs_event_cb_called;
    if ((long)pcStack_138 < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        iVar2 = uv_close();
        return iVar2;
      }
      return fs_event_cb_called;
    }
  }
  else {
    pcStack_150 = (code *)0x189680;
    fs_event_cb_close_cold_1();
  }
  pcStack_150 = run_test_fs_event_start_and_close;
  fs_event_cb_close_cold_2();
  pcStack_150 = (code *)0x1e8b0e;
  uStack_158 = uVar3;
  uVar3 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(uVar3,auStack_1c0);
  uStack_238._16_8_ = SEXT48(iVar2);
  uStack_238.data = (uv_loop_t *)0x0;
  if (uStack_238._16_8_ == 0) {
    in_ECX = 0;
    iVar2 = uv_fs_event_start(auStack_1c0,fs_event_cb_dir,"watch_dir");
    uStack_238._16_8_ = SEXT48(iVar2);
    uStack_238.data = (uv_loop_t *)0x0;
    if (uStack_238._16_8_ != 0) goto LAB_00189840;
    iVar2 = uv_fs_event_init(uVar3,&uStack_238.type);
    uStack_238.data = (void *)(long)iVar2;
    uStack_238.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_238.data != (uv_loop_t *)0x0) goto LAB_0018984f;
    in_ECX = 0;
    iVar2 = uv_fs_event_start(&uStack_238.type,fs_event_cb_dir,"watch_dir");
    uStack_238.data = (void *)(long)iVar2;
    uStack_238.loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)uStack_238.data != (uv_loop_t *)0x0) goto LAB_0018985e;
    uv_close(&uStack_238.type,close_cb);
    uv_close(auStack_1c0,close_cb);
    uv_run(uVar3,0);
    uStack_238.data = (uv_loop_t *)0x2;
    uStack_238.loop = (uv_loop_t *)(long)close_cb_called;
    if (uStack_238.loop != (uv_loop_t *)0x2) goto LAB_0018986d;
    remove("watch_dir/");
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    uStack_238.data = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(uVar3);
    uStack_238.loop = (uv_loop_t *)(long)iVar2;
    if ((uv_loop_t *)uStack_238.data == uStack_238.loop) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00189840:
    run_test_fs_event_start_and_close_cold_2();
LAB_0018984f:
    run_test_fs_event_start_and_close_cold_3();
LAB_0018985e:
    run_test_fs_event_start_and_close_cold_4();
LAB_0018986d:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar7 = &uStack_238;
  __s1 = &uStack_238.loop;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar7 == &fs_event) {
    if (in_ECX != 0) goto LAB_00189959;
    if (extraout_EDX != 2) goto LAB_00189968;
    iVar2 = strcmp((char *)__s1,"file1");
    if (iVar2 != 0) goto LAB_00189977;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      iVar2 = uv_close(&fs_event,close_cb);
      return iVar2;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00189959:
    fs_event_cb_dir_cold_2();
LAB_00189968:
    fs_event_cb_dir_cold_3();
LAB_00189977:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  pcStack_6b8 = (code *)0x1899ab;
  uStack_288 = uVar3;
  uVar3 = uv_default_loop();
  pcStack_6b8 = (code *)0x1899ba;
  create_dir("watch_dir");
  pcStack_6b8 = (code *)0x1899c6;
  create_dir("watch_dir/subfolder");
  lVar5 = 0;
  sVar1 = sStack_6a8;
  do {
    sStack_6a8 = sVar1;
    pcStack_6b8 = (code *)0x1899e4;
    iVar2 = uv_fs_event_init(uVar3,&fs_event);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_00189cd4:
      pcStack_6b8 = (code *)0x189ce3;
      run_test_fs_event_getpath_cold_1();
      goto LAB_00189ce3;
    }
    sStack_698 = 0x400;
    pcStack_6b8 = (code *)0x189a1b;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_690,&sStack_698);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0xffffffffffffffea;
    if (sStack_6a0 != 0xffffffffffffffea) {
LAB_00189cc5:
      pcStack_6b8 = (code *)0x189cd4;
      run_test_fs_event_getpath_cold_2();
      goto LAB_00189cd4;
    }
    __s = *(char **)((long)&DAT_0024dc50 + lVar5);
    pcStack_6b8 = (code *)0x189a5b;
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,__s,0);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_00189cb6:
      pcStack_6b8 = (code *)0x189cc5;
      run_test_fs_event_getpath_cold_3();
      goto LAB_00189cc5;
    }
    sStack_698 = 0;
    pcStack_6b8 = (code *)0x189a92;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_690,&sStack_698);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0xffffffffffffff97;
    if (sStack_6a0 != 0xffffffffffffff97) {
LAB_00189ca7:
      pcStack_6b8 = (code *)0x189cb6;
      run_test_fs_event_getpath_cold_4();
      goto LAB_00189cb6;
    }
    sStack_6a0 = sStack_698;
    sStack_6a8 = 0x400;
    if (0x3ff < (long)sStack_698) {
LAB_00189c98:
      pcStack_6b8 = (code *)0x189ca7;
      run_test_fs_event_getpath_cold_5();
      goto LAB_00189ca7;
    }
    pcStack_6b8 = (code *)0x189ae2;
    sStack_6a8 = strlen(__s);
    sStack_6a8 = sStack_6a8 + 1;
    if (sStack_6a0 != sStack_6a8) {
LAB_00189c89:
      pcStack_6b8 = (code *)0x189c98;
      run_test_fs_event_getpath_cold_6();
      goto LAB_00189c98;
    }
    pcStack_6b8 = (code *)0x189b08;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_690,&sStack_698);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_00189c7a:
      pcStack_6b8 = (code *)0x189c89;
      run_test_fs_event_getpath_cold_7();
      goto LAB_00189c89;
    }
    sStack_6a0 = sStack_698;
    pcStack_6b8 = (code *)0x189b3a;
    sStack_6a8 = strlen(__s);
    if (sStack_6a0 != sStack_6a8) {
LAB_00189c6b:
      pcStack_6b8 = (code *)0x189c7a;
      run_test_fs_event_getpath_cold_8();
      goto LAB_00189c7a;
    }
    pcStack_6b8 = (code *)0x189b5a;
    iVar2 = strcmp(acStack_690,__s);
    if (iVar2 != 0) {
LAB_00189c66:
      pcStack_6b8 = (code *)0x189c6b;
      run_test_fs_event_getpath_cold_9();
      goto LAB_00189c6b;
    }
    pcStack_6b8 = (code *)0x189b6a;
    iVar2 = uv_fs_event_stop(&fs_event);
    sStack_6a0 = (size_t)iVar2;
    sStack_6a8 = 0;
    if (sStack_6a0 != 0) {
LAB_00189c57:
      pcStack_6b8 = (code *)0x189c66;
      run_test_fs_event_getpath_cold_10();
      goto LAB_00189c66;
    }
    pcStack_6b8 = (code *)0x189b99;
    uv_close(&fs_event,close_cb);
    pcStack_6b8 = (code *)0x189ba3;
    uv_run(uVar3,0);
    sStack_6a0 = 1;
    sStack_6a8 = (size_t)close_cb_called;
    if (sStack_6a8 != 1) {
      pcStack_6b8 = (code *)0x189c57;
      run_test_fs_event_getpath_cold_11();
      goto LAB_00189c57;
    }
    close_cb_called = 0;
    lVar5 = lVar5 + 8;
    sVar1 = 1;
  } while (lVar5 != 0x28);
  pcStack_6b8 = (code *)0x189bec;
  remove("watch_dir/");
  pcStack_6b8 = (code *)0x189bfd;
  uv_walk(uVar3,close_walk_cb,0);
  pcStack_6b8 = (code *)0x189c07;
  uv_run(uVar3,0);
  sStack_6a0 = 0;
  pcStack_6b8 = (code *)0x189c18;
  iVar2 = uv_loop_close(uVar3);
  sStack_6a8 = (size_t)iVar2;
  if (sStack_6a0 == sStack_6a8) {
    pcStack_6b8 = (code *)0x189c34;
    uv_library_shutdown();
    return 0;
  }
LAB_00189ce3:
  pcStack_6b8 = run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  pcStack_6d0 = (code *)0x189cfc;
  pcStack_6b8 = (code *)uVar3;
  uVar3 = uv_default_loop();
  pcStack_6d0 = (code *)0x189d10;
  uv_walk(uVar3,close_walk_cb,0);
  pcStack_6d0 = (code *)0x189d1a;
  uv_run(uVar3,0);
  lStack_6c0 = 0;
  pcStack_6d0 = (code *)0x189d28;
  uVar4 = uv_default_loop();
  pcStack_6d0 = (code *)0x189d30;
  iVar2 = uv_loop_close(uVar4);
  lStack_6c8 = (long)iVar2;
  if (lStack_6c0 == lStack_6c8) {
    pcStack_6d0 = (code *)0x189d46;
    uv_library_shutdown();
    return 0;
  }
  pcStack_6d0 = run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_6e8 = (uv_fs_event_t *)0x189d65;
  pcStack_6d0 = (code *)uVar3;
  uVar3 = uv_default_loop();
  puStack_6e8 = (uv_fs_event_t *)0x189d77;
  iVar2 = uv_fs_event_init(uVar3,&fs_event);
  lStack_6d8 = (long)iVar2;
  lStack_6e0 = 0;
  if (lStack_6d8 == 0) {
    puStack_6e8 = (uv_fs_event_t *)0x189db1;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_00189e84;
    puStack_6e8 = (uv_fs_event_t *)0x189dc5;
    iVar2 = uv_is_active(&fs_event);
    lStack_6d8 = (long)iVar2;
    lStack_6e0 = 0;
    if (lStack_6d8 != 0) goto LAB_00189e89;
    puStack_6e8 = (uv_fs_event_t *)0x189dff;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_00189e96;
    puStack_6e8 = (uv_fs_event_t *)0x189e13;
    iVar2 = uv_is_active(&fs_event);
    lStack_6d8 = (long)iVar2;
    lStack_6e0 = 0;
    if (lStack_6d8 != 0) goto LAB_00189e9b;
    puStack_6e8 = (uv_fs_event_t *)0x189e3e;
    uv_walk(uVar3,close_walk_cb,0);
    puStack_6e8 = (uv_fs_event_t *)0x189e48;
    uv_run(uVar3,0);
    lStack_6d8 = 0;
    puStack_6e8 = (uv_fs_event_t *)0x189e59;
    iVar2 = uv_loop_close(uVar3);
    lStack_6e0 = (long)iVar2;
    if (lStack_6d8 == lStack_6e0) {
      puStack_6e8 = (uv_fs_event_t *)0x189e6f;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_6e8 = (uv_fs_event_t *)0x189e84;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_00189e84:
    puStack_6e8 = (uv_fs_event_t *)0x189e89;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_00189e89:
    puStack_6e8 = (uv_fs_event_t *)0x189e96;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_00189e96:
    puStack_6e8 = (uv_fs_event_t *)0x189e9b;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_00189e9b:
    puStack_6e8 = (uv_fs_event_t *)0x189ea8;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_6e8 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_6e8 = &fs_event;
  builtin_strncpy(acStack_7e8,"fs_event_stop_in_cb.txt",0x18);
  uStack_6f0 = uVar3;
  remove(acStack_7e8);
  create_file(acStack_7e8);
  uVar3 = uv_default_loop();
  iVar2 = uv_fs_event_init(uVar3,auStack_758);
  apcStack_7d0[0] = (char *)(long)iVar2;
  if (apcStack_7d0[0] == (char *)0x0) {
    iVar2 = uv_fs_event_start(auStack_758,fs_event_cb_stop,acStack_7e8,0);
    apcStack_7d0[0] = (char *)(long)iVar2;
    if (apcStack_7d0[0] != (char *)0x0) goto LAB_0018a156;
    apcStack_7d0[0] = acStack_7e8;
    uVar3 = uv_default_loop();
    iVar2 = uv_timer_init(uVar3,apcStack_7d0);
    if (iVar2 != 0) goto LAB_0018a163;
    iVar2 = uv_timer_start(apcStack_7d0,timer_cb_touch,100,0);
    if (iVar2 != 0) goto LAB_0018a170;
    if (fs_event_cb_stop_calls != 0) goto LAB_0018a17d;
    if (timer_cb_touch_called != 0) goto LAB_0018a18a;
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0018a197;
    if (fs_event_cb_stop_calls != 1) goto LAB_0018a1a4;
    if (timer_cb_touch_called != 1) goto LAB_0018a1b1;
    uv_close(auStack_758,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0018a1be;
    if (fs_event_cb_stop_calls == 1) {
      remove(acStack_7e8);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar2 = uv_loop_close(uVar3);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018a1d8;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018a156:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018a163:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_0018a170:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_0018a17d:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_0018a18a:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_0018a197:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_0018a1a4:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_0018a1b1:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_0018a1be:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_0018a1d8:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop();
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_no_callback_on_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event,
                        fs_event_cb_file,
                        "watch_dir/file1",
                        0);
  ASSERT_OK(r);

  uv_close((uv_handle_t*)&fs_event, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_OK(fs_event_cb_called);
  ASSERT_EQ(1, close_cb_called);

  /* Cleanup */
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}